

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool q_evaluateRhiConfig(QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  bool bVar1;
  ulong uVar2;
  QDebug *pQVar3;
  SurfaceType *in_RDX;
  QMessageLogger *in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QWidget *in_stack_ffffffffffffff68;
  QDebug in_stack_ffffffffffffff88;
  QDebug local_70;
  QDebug local_68 [4];
  QWidget *in_stack_ffffffffffffffb8;
  QDebug in_stack_ffffffffffffffc0;
  QDebug local_38;
  QDebug local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QBackingStoreRhiSupport::checkForceRhi((QPlatformBackingStoreRhiConfig *)in_RSI,in_RDX);
  if ((uVar2 & 1) == 0) {
    bVar1 = q_evaluateRhiConfigRecursive
                      (in_stack_ffffffffffffff68,
                       (QPlatformBackingStoreRhiConfig *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (SurfaceType *)in_RDI);
    if (bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcWidgetPainting();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x35ea24);
        QMessageLogger::QMessageLogger
                  (in_RSI,(char *)in_RDX,in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38
                   ,(char *)0x35ea3a);
        QMessageLogger::debug();
        pQVar3 = QDebug::operator<<(in_RDI,(char *)in_stack_ffffffffffffff88.stream);
        QDebug::QDebug(&local_70,pQVar3);
        operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,in_stack_ffffffffffffffb8);
        QDebug::operator<<(in_RDI,(char *)in_stack_ffffffffffffff88.stream);
        QDebug::~QDebug(local_68);
        QDebug::~QDebug(&local_70);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff88);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcWidgetPainting();
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x35e8f9);
      QMessageLogger::QMessageLogger
                (in_RSI,(char *)in_RDX,in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38,
                 (char *)0x35e90f);
      QMessageLogger::debug();
      pQVar3 = QDebug::operator<<(in_RDI,(char *)in_stack_ffffffffffffff88.stream);
      QDebug::QDebug(&local_38,pQVar3);
      operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,in_stack_ffffffffffffffb8);
      QDebug::operator<<(in_RDI,(char *)in_stack_ffffffffffffff88.stream);
      QDebug::~QDebug(&local_30);
      QDebug::~QDebug(&local_38);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool q_evaluateRhiConfig(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    // First, check env.vars. or other means that force the usage of rhi-based
    // flushing with a specific graphics API. This takes precedence over what
    // the widgets themselves declare. This is global, applying to all
    // top-levels.
    if (QBackingStoreRhiSupport::checkForceRhi(outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluated to forced flushing with QRhi";
        return true;
    }

    // Otherwise, check the widget hierarchy to see if there is a child (or
    // ourselves) that declare the need for rhi-based composition.
    if (q_evaluateRhiConfigRecursive(w, outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluates to flushing with QRhi";
        return true;
    }

    return false;
}